

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidationContextImpl.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::ValidationContextImpl::addId(ValidationContextImpl *this,XMLCh *content)

{
  RefHashTableOf<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher> *this_00;
  bool bVar1;
  InvalidDatatypeValueException *this_01;
  XMLCh *key;
  XMLRefInfo *local_20;
  XMLRefInfo *idEntry;
  XMLCh *content_local;
  ValidationContextImpl *this_local;
  
  if ((this->fIdRefList != (RefHashTableOf<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher> *)0x0
      ) && ((this->fToCheckIdRefList & 1U) != 0)) {
    local_20 = RefHashTableOf<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher>::get
                         (this->fIdRefList,content);
    if (local_20 == (XMLRefInfo *)0x0) {
      local_20 = (XMLRefInfo *)
                 XMemory::operator_new(0x20,(this->super_ValidationContext).fMemoryManager);
      XMLRefInfo::XMLRefInfo
                (local_20,content,false,false,(this->super_ValidationContext).fMemoryManager);
      this_00 = this->fIdRefList;
      key = XMLRefInfo::getRefName(local_20);
      RefHashTableOf<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher>::put(this_00,key,local_20);
    }
    else {
      bVar1 = XMLRefInfo::getDeclared(local_20);
      if (bVar1) {
        this_01 = (InvalidDatatypeValueException *)__cxa_allocate_exception(0x30);
        InvalidDatatypeValueException::InvalidDatatypeValueException
                  (this_01,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/ValidationContextImpl.cpp"
                   ,0x61,VALUE_ID_Not_Unique,content,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
                   (this->super_ValidationContext).fMemoryManager);
        __cxa_throw(this_01,&InvalidDatatypeValueException::typeinfo,
                    InvalidDatatypeValueException::~InvalidDatatypeValueException);
      }
    }
    XMLRefInfo::setDeclared(local_20,true);
  }
  return;
}

Assistant:

void ValidationContextImpl::addId(const XMLCh * const content)
{
    if (!fIdRefList || !fToCheckIdRefList)
        return;

    XMLRefInfo* idEntry = fIdRefList->get(content);

    if (idEntry)
    {
        if (idEntry->getDeclared())
        {
            ThrowXMLwithMemMgr1(InvalidDatatypeValueException
                    , XMLExcepts::VALUE_ID_Not_Unique
                    , content
                    , fMemoryManager);
        }
    }
    else
    {
        idEntry = new (fMemoryManager) XMLRefInfo(content, false, false, fMemoryManager);
        fIdRefList->put((void*)idEntry->getRefName(), idEntry);
    }

    //
    //  Mark it declared
    //
    idEntry->setDeclared(true);

}